

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::setComment(Value *this,String *comment,CommentPlacement placement)

{
  CommentPlacement slot;
  ulong uVar1;
  char *pcVar2;
  String local_210;
  String local_1f0;
  ostringstream local_1d0 [8];
  OStringStream oss;
  allocator<char> local_41;
  String local_40;
  CommentPlacement local_1c;
  String *pSStack_18;
  CommentPlacement placement_local;
  String *comment_local;
  Value *this_local;
  
  local_1c = placement;
  pSStack_18 = comment;
  comment_local = (String *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 == '\n') {
      std::__cxx11::string::pop_back();
    }
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)comment);
    if (*pcVar2 != '\0') {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)comment);
      if (*pcVar2 != '/') {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        std::operator<<((ostream *)local_1d0,
                        "in Json::Value::setComment(): Comments must start with /");
        std::__cxx11::ostringstream::str();
        throwLogicError(&local_1f0);
      }
    }
    slot = local_1c;
    std::__cxx11::string::string((string *)&local_210,(string *)comment);
    Comments::set(&this->comments_,slot,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"assert json failed",&local_41);
  throwLogicError(&local_40);
}

Assistant:

void Value::setComment(String comment, CommentPlacement placement) {
  if (!comment.empty() && (comment.back() == '\n')) {
    // Always discard trailing newline, to aid indentation.
    comment.pop_back();
  }
  JSON_ASSERT(!comment.empty());
  JSON_ASSERT_MESSAGE(
      comment[0] == '\0' || comment[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  comments_.set(placement, std::move(comment));
}